

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

Vec_Int_t * Gia_ManGetCex(Gia_Man_t *pGia,Vec_Int_t *vId2Lit,sat_solver *pSat,Vec_Int_t *vCex)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int Value;
  int LitSat;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCex_local;
  sat_solver *pSat_local;
  Vec_Int_t *vId2Lit_local;
  Gia_Man_t *pGia_local;
  
  Vec_IntClear(vCex);
  Value = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(pGia);
    bVar5 = false;
    if (Value < iVar1) {
      _LitSat = Gia_ManCi(pGia,Value);
      bVar5 = _LitSat != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjId(pGia,_LitSat);
    iVar2 = Vec_IntSize(vId2Lit);
    if (iVar1 < iVar2) {
      iVar1 = Gia_ObjId(pGia,_LitSat);
      iVar1 = Vec_IntEntry(vId2Lit,iVar1);
      if (iVar1 == 0) {
        Vec_IntPush(vCex,2);
      }
      else {
        if (iVar1 < 1) {
          __assert_fail("LitSat > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                        ,0x303,
                        "Vec_Int_t *Gia_ManGetCex(Gia_Man_t *, Vec_Int_t *, sat_solver *, Vec_Int_t *)"
                       );
        }
        iVar2 = Abc_Lit2Var(iVar1);
        uVar3 = sat_solver_var_value(pSat,iVar2);
        uVar4 = Abc_LitIsCompl(iVar1);
        Vec_IntPush(vCex,uVar3 ^ uVar4);
      }
    }
    else {
      Vec_IntPush(vCex,2);
    }
    Value = Value + 1;
  }
  return vCex;
}

Assistant:

static Vec_Int_t * Gia_ManGetCex( Gia_Man_t * pGia, Vec_Int_t * vId2Lit, sat_solver * pSat, Vec_Int_t * vCex )
{
    Gia_Obj_t * pObj;
    int i, LitSat, Value;
    Vec_IntClear( vCex );
    Gia_ManForEachPi( pGia, pObj, i )
    {
        if ( Gia_ObjId(pGia, pObj) >= Vec_IntSize(vId2Lit) )
        {
            Vec_IntPush( vCex, 2 );
            continue;
        }
        LitSat = Vec_IntEntry( vId2Lit, Gia_ObjId(pGia, pObj) );
        if ( LitSat == 0 )
        {
            Vec_IntPush( vCex, 2 );
            continue;
        }
        assert( LitSat > 0 );
        Value = sat_solver_var_value(pSat, Abc_Lit2Var(LitSat)) ^ Abc_LitIsCompl(LitSat);
        Vec_IntPush( vCex, Value );
    }
    return vCex;
}